

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::clean
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this)

{
  resizable_tensor::clear(&this->x_grad);
  resizable_tensor::clear(&this->grad_final);
  resizable_tensor::clear(&this->cached_output);
  resizable_tensor::clear(&this->params_grad);
  resizable_tensor::clear(&this->temp_tensor);
  this->gradient_input_is_stale = true;
  return;
}

Assistant:

void clean()
        {
            x_grad.clear();
            grad_final.clear();
            cached_output.clear();
            params_grad.clear();
            temp_tensor.clear();
            gradient_input_is_stale = true;
            call_clean_method_if_exists(details);
        }